

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

char * __thiscall
adios2::format::BP5Serializer::BuildVarName
          (BP5Serializer *this,char *base_name,ShapeID Shape,int type,int element_size)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  
  pcVar1 = NamePrefix(Shape);
  sVar2 = strlen(base_name);
  sVar3 = strlen(pcVar1);
  sVar2 = sVar2 + sVar3 + 0x12;
  __dest = (char *)malloc(sVar2);
  if (element_size == 0) {
    strcpy(__dest,pcVar1);
    sVar2 = strlen(__dest);
    (__dest + sVar2)[0] = '_';
    (__dest + sVar2)[1] = '\0';
  }
  else {
    snprintf(__dest,sVar2,"%s_%d_%d_",pcVar1,(ulong)(uint)element_size,(ulong)(uint)type);
  }
  pcVar1 = strcat(__dest,base_name);
  return pcVar1;
}

Assistant:

char *BP5Serializer::BuildVarName(const char *base_name, const ShapeID Shape, const int type,
                                  const int element_size)
{

    const char *Prefix = NamePrefix(Shape);
    auto Len = strlen(base_name) + 2 + strlen(Prefix) + 16;
    char *Ret = (char *)malloc(Len);
    if (element_size == 0)
    {
        strcpy(Ret, Prefix);
        strcat(Ret, "_");
        strcat(Ret, base_name);
    }
    else
    {
        snprintf(Ret, Len, "%s_%d_%d_", Prefix, element_size, type);
        strcat(Ret, base_name);
    }
    return Ret;
}